

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void pmu_init_arm(ARMCPU *cpu)

{
  ushort uVar1;
  _Bool _Var2;
  long lVar3;
  ulong uVar4;
  _func__Bool_CPUARMState_ptr **pp_Var5;
  
  for (lVar3 = 0; lVar3 != 0x7a; lVar3 = lVar3 + 2) {
    *(undefined2 *)((long)supported_event_map + lVar3) = 0xffff;
  }
  cpu->pmceid0 = 0;
  cpu->pmceid1 = 0;
  pp_Var5 = &pm_events[0].supported;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 6) {
      return;
    }
    uVar1 = ((pm_event *)(pp_Var5 + -1))->number;
    if (0x3c < (ulong)uVar1) break;
    _Var2 = (**pp_Var5)(&cpu->env);
    if (_Var2) {
      supported_event_map[uVar1] = (uint16_t)lVar3;
      uVar4 = 1L << ((byte)uVar1 & 0x1f);
      if (uVar1 < 0x20) {
        cpu->pmceid0 = cpu->pmceid0 | uVar4;
      }
      else {
        cpu->pmceid1 = cpu->pmceid1 | uVar4;
      }
    }
    lVar3 = lVar3 + 1;
    pp_Var5 = pp_Var5 + 4;
  }
  __assert_fail("cnt->number <= MAX_EVENT_ID",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                ,0x3aa,"void pmu_init_arm(ARMCPU *)");
}

Assistant:

void pmu_init(ARMCPU *cpu)
{
    unsigned int i;

    /*
     * Empty supported_event_map and cpu->pmceid[01] before adding supported
     * events to them
     */
    for (i = 0; i < ARRAY_SIZE(supported_event_map); i++) {
        supported_event_map[i] = UNSUPPORTED_EVENT;
    }
    cpu->pmceid0 = 0;
    cpu->pmceid1 = 0;

    for (i = 0; i < ARRAY_SIZE(pm_events); i++) {
        const pm_event *cnt = &pm_events[i];
        assert(cnt->number <= MAX_EVENT_ID);
        /* We do not currently support events in the 0x40xx range */
        assert(cnt->number <= 0x3f);

        if (cnt->supported(&cpu->env)) {
            supported_event_map[cnt->number] = i;
            uint64_t event_mask = 1ULL << (cnt->number & 0x1f);
            if (cnt->number & 0x20) {
                cpu->pmceid1 |= event_mask;
            } else {
                cpu->pmceid0 |= event_mask;
            }
        }
    }
}